

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O0

void R_DrawFogBoundary(int x1,int x2,short *uclip,short *dclip)

{
  lighttable_t *plVar1;
  int iVar2;
  fixed_t fVar3;
  int iVar4;
  WORD clear;
  double dVar5;
  int stop;
  int xr;
  int b1;
  int t1;
  BYTE *basecolormapdata;
  int local_40;
  int lcolormap;
  int rcolormap;
  int b2;
  int t2;
  int x;
  double light;
  double lightstep;
  short *dclip_local;
  short *uclip_local;
  int x2_local;
  int x1_local;
  
  iVar4 = wallshade;
  _t2 = (double)(rw_light + rw_lightstep * (float)((x2 - x1) + -1));
  iVar2 = x2 + -1;
  rcolormap = (int)uclip[iVar2];
  lcolormap = (int)dclip[iVar2];
  dVar5 = MIN<double>(24.0,_t2);
  fVar3 = FloatToFixed(dVar5);
  local_40 = clamp<int>(iVar4 - fVar3 >> 0x10,0,0x1f);
  plVar1 = basecolormap->Maps;
  if (rcolormap < lcolormap) {
    clearbufshort(spanend + rcolormap,lcolormap - rcolormap,(WORD)iVar2);
  }
  dc_colormap = plVar1 + (local_40 << 8);
  for (b2 = x2 + -2; iVar4 = wallshade, x1 <= b2; b2 = b2 + -1) {
    xr = (int)uclip[b2];
    stop = (int)dclip[b2];
    iVar2 = b2 + 1;
    _t2 = _t2 - (double)rw_lightstep;
    dVar5 = MIN<double>(24.0,_t2);
    fVar3 = FloatToFixed(dVar5);
    iVar4 = clamp<int>(iVar4 - fVar3 >> 0x10,0,0x1f);
    clear = (WORD)b2;
    if (iVar4 == local_40) {
      if (dc_colormap == plVar1) {
        iVar4 = MIN<int>(xr,lcolormap);
        rcolormap = MAX<int>(rcolormap,iVar4);
        iVar4 = MAX<int>(stop,rcolormap);
        lcolormap = MIN<int>(lcolormap,iVar4);
      }
      else {
        iVar4 = MIN<int>(xr,lcolormap);
        while (rcolormap < iVar4) {
          R_DrawFogBoundaryLine(rcolormap,iVar2);
          rcolormap = rcolormap + 1;
        }
        iVar4 = MAX<int>(stop,rcolormap);
        while (iVar4 < lcolormap) {
          lcolormap = lcolormap + -1;
          R_DrawFogBoundaryLine(lcolormap,iVar2);
        }
      }
      iVar4 = MIN<int>(rcolormap,stop);
      while (xr < iVar4) {
        spanend[xr] = clear;
        xr = xr + 1;
      }
      iVar4 = MAX<int>(lcolormap,rcolormap);
      while (iVar4 < stop) {
        stop = stop + -1;
        spanend[stop] = clear;
      }
    }
    else {
      if ((rcolormap < lcolormap) && (local_40 != 0)) {
        R_DrawFogBoundarySection(rcolormap,lcolormap,iVar2);
      }
      if (xr < rcolormap) {
        rcolormap = xr;
      }
      if (lcolormap < stop) {
        lcolormap = stop;
      }
      if (rcolormap < lcolormap) {
        clearbufshort(spanend + rcolormap,lcolormap - rcolormap,clear);
      }
      dc_colormap = plVar1 + (iVar4 << 8);
      local_40 = iVar4;
    }
    rcolormap = (int)uclip[b2];
    lcolormap = (int)dclip[b2];
  }
  if ((rcolormap < lcolormap) && (local_40 != 0)) {
    R_DrawFogBoundarySection(rcolormap,lcolormap,x1);
  }
  return;
}

Assistant:

void R_DrawFogBoundary (int x1, int x2, short *uclip, short *dclip)
{
	// This is essentially the same as R_MapVisPlane but with an extra step
	// to create new horizontal spans whenever the light changes enough that
	// we need to use a new colormap.

	double lightstep = rw_lightstep;
	double light = rw_light + rw_lightstep*(x2-x1-1);
	int x = x2-1;
	int t2 = uclip[x];
	int b2 = dclip[x];
	int rcolormap = GETPALOOKUP(light, wallshade);
	int lcolormap;
	BYTE *basecolormapdata = basecolormap->Maps;

	if (b2 > t2)
	{
		clearbufshort (spanend+t2, b2-t2, x);
	}

	dc_colormap = basecolormapdata + (rcolormap << COLORMAPSHIFT);

	for (--x; x >= x1; --x)
	{
		int t1 = uclip[x];
		int b1 = dclip[x];
		const int xr = x+1;
		int stop;

		light -= rw_lightstep;
		lcolormap = GETPALOOKUP(light, wallshade);
		if (lcolormap != rcolormap)
		{
			if (t2 < b2 && rcolormap != 0)
			{ // Colormap 0 is always the identity map, so rendering it is
			  // just a waste of time.
				R_DrawFogBoundarySection (t2, b2, xr);
			}
			if (t1 < t2) t2 = t1;
			if (b1 > b2) b2 = b1;
			if (t2 < b2)
			{
				clearbufshort (spanend+t2, b2-t2, x);
			}
			rcolormap = lcolormap;
			dc_colormap = basecolormapdata + (lcolormap << COLORMAPSHIFT);
		}
		else
		{
			if (dc_colormap != basecolormapdata)
			{
				stop = MIN (t1, b2);
				while (t2 < stop)
				{
					R_DrawFogBoundaryLine (t2++, xr);
				}
				stop = MAX (b1, t2);
				while (b2 > stop)
				{
					R_DrawFogBoundaryLine (--b2, xr);
				}
			}
			else
			{
				t2 = MAX (t2, MIN (t1, b2));
				b2 = MIN (b2, MAX (b1, t2));
			}

			stop = MIN (t2, b1);
			while (t1 < stop)
			{
				spanend[t1++] = x;
			}
			stop = MAX (b2, t2);
			while (b1 > stop)
			{
				spanend[--b1] = x;
			}
		}

		t2 = uclip[x];
		b2 = dclip[x];
	}
	if (t2 < b2 && rcolormap != 0)
	{
		R_DrawFogBoundarySection (t2, b2, x1);
	}
}